

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

size_t webrtc::ReadInt16FromFileToDoubleBuffer(FileWrapper *file,size_t length,double *buffer)

{
  int iVar1;
  size_t i;
  __uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true> buffer_00;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  unique_ptr<short[],_std::default_delete<short[]>_> buffer16;
  
  if (file == (FileWrapper *)0x0) {
    sVar2 = 0;
  }
  else {
    iVar1 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar2 = 0;
    if (((length != 0) && (buffer != (double *)0x0)) && ((char)iVar1 != '\0')) {
      uVar4 = 0xffffffffffffffff;
      if (-1 < (long)length) {
        uVar4 = length * 2;
      }
      buffer_00.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
      super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
      super__Head_base<0UL,_short_*,_false>._M_head_impl =
           (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)operator_new__(uVar4);
      buffer16._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
      super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
      super__Head_base<0UL,_short_*,_false>._M_head_impl =
           (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)
           (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)
           buffer_00.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
      sVar2 = ReadInt16BufferFromFile
                        (file,length,
                         (int16_t *)
                         buffer_00.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                         super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                         super__Head_base<0UL,_short_*,_false>._M_head_impl);
      for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
        buffer[sVar3] =
             (double)(int)*(short *)((long)buffer_00.
                                           super___uniq_ptr_impl<short,_std::default_delete<short[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>
                                           .super__Head_base<0UL,_short_*,_false>._M_head_impl +
                                    sVar3 * 2);
      }
      std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&buffer16);
    }
  }
  return sVar2;
}

Assistant:

size_t ReadInt16FromFileToDoubleBuffer(FileWrapper* file,
                                       size_t length,
                                       double* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<int16_t[]> buffer16(new int16_t[length]);

  size_t int16s_read = ReadInt16BufferFromFile(file, length, buffer16.get());

  for (size_t i = 0; i < int16s_read; ++i) {
    buffer[i] = buffer16[i];
  }

  return int16s_read;
}